

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O0

void jpeg_buffer_src(j_decompress_ptr cinfo,Buffer *buffer)

{
  jpeg_source_mgr *pjVar1;
  size_t sVar2;
  uchar *puVar3;
  jpeg_source_mgr *src;
  Buffer *buffer_local;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = (jpeg_source_mgr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x38);
  cinfo->src = pjVar1;
  pjVar1 = cinfo->src;
  pjVar1->init_source = init_buffer_source;
  pjVar1->fill_input_buffer = fill_buffer_input_buffer;
  pjVar1->skip_input_data = skip_buffer_input_data;
  pjVar1->resync_to_restart = jpeg_resync_to_restart;
  pjVar1->term_source = term_buffer_source;
  sVar2 = Buffer::getSize(buffer);
  pjVar1->bytes_in_buffer = sVar2;
  puVar3 = Buffer::getBuffer(buffer);
  pjVar1->next_input_byte = puVar3;
  return;
}

Assistant:

static void
jpeg_buffer_src(j_decompress_ptr cinfo, Buffer* buffer)
{
    cinfo->src = reinterpret_cast<jpeg_source_mgr*>(
        // line-break
        (*cinfo->mem->alloc_small)(
            reinterpret_cast<j_common_ptr>(cinfo), JPOOL_PERMANENT, sizeof(jpeg_source_mgr)));

    jpeg_source_mgr* src = cinfo->src;
    src->init_source = init_buffer_source;
    src->fill_input_buffer = fill_buffer_input_buffer;
    src->skip_input_data = skip_buffer_input_data;
    src->resync_to_restart = jpeg_resync_to_restart; /* use default method */
    src->term_source = term_buffer_source;
    src->bytes_in_buffer = buffer->getSize();
    src->next_input_byte = buffer->getBuffer();
}